

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeRun(JunitReporter *this,TestRunNode *testRunNode,double suiteTime)

{
  StringRef name;
  StringRef name_00;
  StringRef text;
  StringRef text_00;
  StringRef attribute;
  StringRef attribute_00;
  StringRef name_01;
  StringRef name_02;
  StringRef attribute_01;
  StringRef attribute_02;
  StringRef attribute_03;
  StringRef attribute_04;
  StringRef attribute_05;
  StringRef name_03;
  StringRef name_04;
  StringRef name_05;
  StringRef name_06;
  StringRef name_07;
  StringRef name_08;
  StringRef name_09;
  StringRef name_10;
  StringRef name_11;
  bool bVar1;
  int iVar2;
  ScopedElement *this_00;
  StringRef *this_01;
  undefined8 *in_RSI;
  long in_RDI;
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *child;
  const_iterator __end1;
  const_iterator __begin1;
  ChildNodes *__range1;
  ScopedElement properties;
  TestRunStats *stats;
  ScopedElement e;
  string *in_stack_fffffffffffffb78;
  StringRef *in_stack_fffffffffffffb80;
  TestSpec *in_stack_fffffffffffffb88;
  XmlFormatting XVar3;
  ScopedElement *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  XmlFormatting in_stack_fffffffffffffb9c;
  string *str;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *in_stack_fffffffffffffba0;
  XmlWriter *in_stack_fffffffffffffba8;
  ScopedElement *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  XmlWriter *in_stack_fffffffffffffbc0;
  double in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  char *in_stack_fffffffffffffbd8;
  size_type in_stack_fffffffffffffbe0;
  unsigned_long *in_stack_fffffffffffffbf8;
  XmlWriter *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  size_type in_stack_fffffffffffffc10;
  string local_398 [55];
  allocator<char> local_361;
  string local_360 [24];
  TestCaseNode *in_stack_fffffffffffffcb8;
  JunitReporter *in_stack_fffffffffffffcc0;
  string local_330 [55];
  undefined1 local_2f9 [49];
  reference local_2c8;
  unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *local_2c0;
  __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  local_2b8;
  undefined8 *local_2b0;
  StringRef local_2a8;
  StringRef local_298;
  StringRef local_288;
  undefined1 local_271 [73];
  StringRef local_228;
  StringRef local_218;
  allocator<char> local_201;
  string local_200 [55];
  allocator<char> local_1c9;
  string local_1c8 [48];
  string local_198 [48];
  StringRef local_168;
  string local_158 [48];
  StringRef local_128;
  StringRef local_118;
  StringRef local_108;
  StringRef local_f8;
  StringRef local_e8;
  uint64_t local_d8;
  StringRef local_d0;
  StringRef local_c0;
  long local_b0;
  StringRef local_a8;
  StringRef local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  StringRef local_78;
  undefined8 *local_68;
  allocator<char> local_49;
  string local_48 [56];
  undefined8 *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c
            );
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_68 = local_10;
  local_78 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  local_88 = *local_68;
  uStack_80 = local_68[1];
  name_03.m_size = in_stack_fffffffffffffbe0;
  name_03.m_start = in_stack_fffffffffffffbd8;
  attribute_01.m_size._0_4_ = in_stack_fffffffffffffbd0;
  attribute_01.m_start = (char *)in_stack_fffffffffffffbc8;
  attribute_01.m_size._4_4_ = in_stack_fffffffffffffbd4;
  XmlWriter::writeAttribute(in_stack_fffffffffffffbc0,name_03,attribute_01);
  local_98 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  name_08.m_size = in_stack_fffffffffffffc10;
  name_08.m_start = in_stack_fffffffffffffc08;
  XmlWriter::writeAttribute<unsigned_int,void>
            (in_stack_fffffffffffffc00,name_08,(uint *)in_stack_fffffffffffffbf8);
  local_a8 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  local_b0 = local_68[3] - (ulong)*(uint *)(in_RDI + 0x140);
  name_09.m_size = in_stack_fffffffffffffc10;
  name_09.m_start = in_stack_fffffffffffffc08;
  XmlWriter::writeAttribute<unsigned_long,void>
            (in_stack_fffffffffffffc00,name_09,in_stack_fffffffffffffbf8);
  local_c0 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  name_10.m_size = in_stack_fffffffffffffc10;
  name_10.m_start = in_stack_fffffffffffffc08;
  XmlWriter::writeAttribute<unsigned_long,void>
            (in_stack_fffffffffffffc00,name_10,in_stack_fffffffffffffbf8);
  local_d0 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  local_d8 = Counts::total((Counts *)(local_68 + 2));
  name_11.m_size = in_stack_fffffffffffffc10;
  name_11.m_start = in_stack_fffffffffffffc08;
  XmlWriter::writeAttribute<unsigned_long,void>
            (in_stack_fffffffffffffc00,name_11,in_stack_fffffffffffffbf8);
  local_e8 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  local_f8 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  name_04.m_size = in_stack_fffffffffffffbe0;
  name_04.m_start = in_stack_fffffffffffffbd8;
  attribute_02.m_size._0_4_ = in_stack_fffffffffffffbd0;
  attribute_02.m_start = (char *)in_stack_fffffffffffffbc8;
  attribute_02.m_size._4_4_ = in_stack_fffffffffffffbd4;
  XmlWriter::writeAttribute(in_stack_fffffffffffffbc0,name_04,attribute_02);
  iVar2 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x58))();
  if (iVar2 == 2) {
    local_108 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    local_118 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    name_05.m_size = in_stack_fffffffffffffbe0;
    name_05.m_start = in_stack_fffffffffffffbd8;
    attribute_03.m_size._0_4_ = in_stack_fffffffffffffbd0;
    attribute_03.m_start = (char *)in_stack_fffffffffffffbc8;
    attribute_03.m_size._4_4_ = in_stack_fffffffffffffbd4;
    XmlWriter::writeAttribute(in_stack_fffffffffffffbc0,name_05,attribute_03);
  }
  else {
    local_128 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    (anonymous_namespace)::formatDuration_abi_cxx11_(in_stack_fffffffffffffbc8);
    StringRef::StringRef(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    name_06.m_size = in_stack_fffffffffffffbe0;
    name_06.m_start = in_stack_fffffffffffffbd8;
    attribute_04.m_size._0_4_ = in_stack_fffffffffffffbd0;
    attribute_04.m_start = (char *)in_stack_fffffffffffffbc8;
    attribute_04.m_size._4_4_ = in_stack_fffffffffffffbd4;
    XmlWriter::writeAttribute(in_stack_fffffffffffffbc0,name_06,attribute_04);
    std::__cxx11::string::~string(local_158);
  }
  local_168 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  (anonymous_namespace)::getCurrentTimestamp_abi_cxx11_();
  StringRef::StringRef(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  name_07.m_size = in_stack_fffffffffffffbe0;
  name_07.m_start = in_stack_fffffffffffffbd8;
  attribute_05.m_size._0_4_ = in_stack_fffffffffffffbd0;
  attribute_05.m_start = (char *)in_stack_fffffffffffffbc8;
  attribute_05.m_size._4_4_ = in_stack_fffffffffffffbd4;
  XmlWriter::writeAttribute(in_stack_fffffffffffffbc0,name_07,attribute_05);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c
            );
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c
            );
  local_218 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  local_228 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  name_01.m_size = (size_type)in_stack_fffffffffffffbc0;
  name_01.m_start = in_stack_fffffffffffffbb8;
  attribute.m_size = (size_type)in_stack_fffffffffffffbb0;
  attribute.m_start = &in_stack_fffffffffffffba8->m_tagIsOpen;
  XmlWriter::ScopedElement::writeAttribute
            ((ScopedElement *)in_stack_fffffffffffffba0,name_01,attribute);
  local_271._57_16_ =
       (undefined1  [16])
       operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
  local_271._53_4_ = (**(code **)(**(long **)(in_RDI + 0x10) + 0x88))();
  name.m_start._4_4_ = in_stack_fffffffffffffb9c;
  name.m_start._0_4_ = in_stack_fffffffffffffb98;
  name.m_size = (size_type)in_stack_fffffffffffffba0;
  XmlWriter::ScopedElement::writeAttribute<unsigned_int,void>
            (in_stack_fffffffffffffb90,name,(uint *)in_stack_fffffffffffffb88);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1a6c04);
  if (bVar1) {
    in_stack_fffffffffffffbb8 = (char *)(in_RDI + 0xb0);
    in_stack_fffffffffffffbc0 = (XmlWriter *)local_271;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (allocator<char> *)in_stack_fffffffffffffbb0);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0,
               in_stack_fffffffffffffb9c);
    local_288 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    local_298 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    name_02.m_size = (size_type)in_stack_fffffffffffffbc0;
    name_02.m_start = in_stack_fffffffffffffbb8;
    attribute_00.m_size = (size_type)in_stack_fffffffffffffbb0;
    attribute_00.m_start = &in_stack_fffffffffffffba8->m_tagIsOpen;
    in_stack_fffffffffffffbb0 =
         XmlWriter::ScopedElement::writeAttribute
                   ((ScopedElement *)in_stack_fffffffffffffba0,name_02,attribute_00);
    local_2a8 = operator____sr((char *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
    in_stack_fffffffffffffba8 = (XmlWriter *)(**(code **)(**(long **)(in_RDI + 0x10) + 0x68))();
    name_00.m_start._4_4_ = in_stack_fffffffffffffb9c;
    name_00.m_start._0_4_ = in_stack_fffffffffffffb98;
    name_00.m_size = (size_type)in_stack_fffffffffffffba0;
    XmlWriter::ScopedElement::writeAttribute<Catch::TestSpec,void>
              (in_stack_fffffffffffffb90,name_00,in_stack_fffffffffffffb88);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
    std::__cxx11::string::~string((string *)(local_271 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_271);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
  local_2b0 = local_10 + 0xb;
  local_2b8._M_current =
       (unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
        *)std::
          vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
          ::begin((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                   *)in_stack_fffffffffffffb78);
  local_2c0 = (unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
               *)std::
                 vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                 ::end((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                        *)in_stack_fffffffffffffb78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                        *)in_stack_fffffffffffffb80,
                       (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                        *)in_stack_fffffffffffffb78);
    XVar3 = (XmlFormatting)((ulong)in_stack_fffffffffffffb88 >> 0x20);
    if (!bVar1) break;
    local_2c8 = __gnu_cxx::
                __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                ::operator*(&local_2b8);
    in_stack_fffffffffffffba0 =
         Detail::
         unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
         ::operator*(local_2c8);
    writeTestCase(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
    ::operator++(&local_2b8);
  }
  this_00 = (ScopedElement *)(in_RDI + 0xb0);
  str = (string *)local_2f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0,
             (XmlFormatting)((ulong)str >> 0x20));
  trim(str);
  StringRef::StringRef(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  text.m_size = (size_type)in_stack_fffffffffffffba0;
  text.m_start = (char *)str;
  XmlWriter::ScopedElement::writeText(this_00,text,XVar3);
  std::__cxx11::string::~string(local_330);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffb80);
  std::__cxx11::string::~string((string *)(local_2f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2f9);
  this_01 = (StringRef *)(in_RDI + 0xb0);
  XVar3 = (XmlFormatting)((ulong)&local_361 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffba8,(string *)in_stack_fffffffffffffba0,
             (XmlFormatting)((ulong)str >> 0x20));
  trim(str);
  StringRef::StringRef(this_01,in_stack_fffffffffffffb78);
  text_00.m_size = (size_type)in_stack_fffffffffffffba0;
  text_00.m_start = (char *)str;
  XmlWriter::ScopedElement::writeText(this_00,text_00,XVar3);
  std::__cxx11::string::~string(local_398);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_01);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_01);
  return;
}

Assistant:

void JunitReporter::writeRun( TestRunNode const& testRunNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestRunStats const& stats = testRunNode.value;
        xml.writeAttribute( "name"_sr, stats.runInfo.name );
        xml.writeAttribute( "errors"_sr, unexpectedExceptions );
        xml.writeAttribute( "failures"_sr, stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "skipped"_sr, stats.totals.assertions.skipped );
        xml.writeAttribute( "tests"_sr, stats.totals.assertions.total() );
        xml.writeAttribute( "hostname"_sr, "tbd"_sr ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time"_sr, ""_sr );
        else
            xml.writeAttribute( "time"_sr, formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp"_sr, getCurrentTimestamp() );

        // Write properties
        {
            auto properties = xml.scopedElement("properties");
            xml.scopedElement("property")
                .writeAttribute("name"_sr, "random-seed"_sr)
                .writeAttribute("value"_sr, m_config->rngSeed());
            if (m_config->testSpec().hasFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name"_sr, "filters"_sr)
                    .writeAttribute("value"_sr, m_config->testSpec());
            }
        }

        // Write test cases
        for( auto const& child : testRunNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }